

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

int ON_String::FormatVargsOutputCount(char *format,__va_list_tag *args)

{
  undefined8 uStack_38;
  int len;
  va_list args_copy;
  __va_list_tag *args_local;
  char *format_local;
  
  if ((format == (char *)0x0) || (*format == '\0')) {
    format_local._4_4_ = 0;
  }
  else {
    args_copy[0].overflow_arg_area = args->reg_save_area;
    uStack_38._0_4_ = args->gp_offset;
    uStack_38._4_4_ = args->fp_offset;
    args_copy[0]._0_8_ = args->overflow_arg_area;
    args_copy[0].reg_save_area = args;
    format_local._4_4_ = vsnprintf((char *)0x0,0,format,&uStack_38);
  }
  return format_local._4_4_;
}

Assistant:

int ON_String::FormatVargsOutputCount(
  const char* format,
  va_list args
  )
{
  if ( nullptr == format || 0 == format[0] )
    return 0;

#if defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
  // CLang modifies args so a copy is required
  va_list args_copy;
  va_copy (args_copy, args);

#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  int len = vsnprintf(nullptr, 0, format, args_copy);
#else
  int len = vsnprintf_l(nullptr, 0, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
#endif
  va_end(args_copy);
  return len;
#else
  return _vscprintf_p_l(format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
}